

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O3

void __thiscall create::Serial::signalHandler(Serial *this,error_code *error,int signal_number)

{
  undefined1 in_AL;
  undefined7 in_register_00000001;
  Opcode local_18 [2];
  
  if ((error->failed_ == false) && ((this->port).impl_.implementation_.descriptor_ != -1)) {
    local_18[0] = (Opcode)CONCAT71(in_register_00000001,in_AL);
    local_18[1] = 0x80;
    sendOpcode(this,local_18 + 1);
    local_18[0] = 0xad;
    sendOpcode(this,local_18);
    exit(signal_number);
  }
  return;
}

Assistant:

void Serial::signalHandler(const boost::system::error_code& error, int signal_number) {
    if (!error) {
      if (connected()) {
        // Ensure not in Safe/Full modes
        sendOpcode(OC_START);
        // Stop OI
        sendOpcode(OC_STOP);
        exit(signal_number);
      }
    }
  }